

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

void glist_menu_open(_glist *x)

{
  _glist *in_RAX;
  _glist *p_Var1;
  
  if ((x->field_0xe8 & 8) == 0) {
    p_Var1 = glist_getcanvas(in_RAX);
    if (((p_Var1->field_0xe8 & 2) != 0) && ((*(ushort *)&x->field_0xe8 & 0x101) == 0x100)) {
      p_Var1 = x->gl_owner;
      if (p_Var1 == (_glist *)0x0) {
        bug("glist_menu_open");
      }
      else {
        gobj_vis((t_gobj *)x,p_Var1,0);
        if (x->gl_editor != (t_editor *)0x0) {
          canvas_destroy_editor(x);
        }
        x->field_0xe8 = x->field_0xe8 | 1;
        gobj_vis((t_gobj *)x,p_Var1,1);
      }
    }
  }
  canvas_vis(x,1.0);
  return;
}

Assistant:

void glist_menu_open(t_glist *x)
{
    if (glist_isvisible(x) && !glist_istoplevel(x))
    {
        t_glist *gl2 = x->gl_owner;
        if (!gl2)
            bug("glist_menu_open");  /* shouldn't happen but not dangerous */
        else
        {
                /* erase ourself in parent window */
            gobj_vis(&x->gl_gobj, gl2, 0);
                    /* get rid of our editor (and subeditors) */
            if (x->gl_editor)
                canvas_destroy_editor(x);
            x->gl_havewindow = 1;
                    /* redraw ourself in parent window (blanked out this time) */
            gobj_vis(&x->gl_gobj, gl2, 1);
        }
    }
    canvas_vis(x, 1);
}